

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_function_primitive_apply
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  ulong uVar2;
  size_t i;
  long lVar3;
  long lVar4;
  ulong uVar5;
  size_t i_1;
  size_t argumentCount_00;
  ulong uVar6;
  bool bVar7;
  sysbvm_stackFrameRecord_t local_108;
  undefined8 local_f8;
  anon_struct_136_2_7a050327_for_gcRoots *local_f0;
  sysbvm_functionCallFrameStack_t callFrameStack;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  uVar5 = arguments[1];
  lVar4 = -1;
  bVar7 = true;
  if (((uVar5 & 0xf) == 0 && uVar5 != 0) && (7 < *(uint *)(uVar5 + 0xc))) {
    uVar2 = (ulong)(*(uint *)(uVar5 + 0xc) >> 3);
    uVar5 = *(ulong *)(uVar5 + 8 + uVar2 * 8);
    lVar4 = uVar2 - 1;
    if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
      uVar5 = (ulong)(*(uint *)(uVar5 + 0xc) >> 3);
    }
    else {
      uVar5 = 0;
    }
    argumentCount_00 = uVar5 + lVar4;
    bVar7 = false;
  }
  else {
    argumentCount_00 = 0;
    uVar5 = 0;
  }
  memset(&callFrameStack,0,0xb0);
  local_108.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_108.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_108._12_4_ = 0;
  local_f8 = 0x11;
  local_f0 = &callFrameStack.gcRoots;
  sysbvm_stackFrame_pushRecord(&local_108);
  sysbvm_functionCallFrameStack_begin(context,&callFrameStack,*arguments,argumentCount_00,0);
  if (!bVar7) {
    lVar3 = 0;
    while( true ) {
      uVar2 = arguments[1];
      bVar7 = (uVar2 & 0xf) != 0;
      if (lVar4 == lVar3) break;
      if (bVar7 || uVar2 == 0) {
        sVar1 = 0;
      }
      else {
        sVar1 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + lVar3 * 8);
      }
      sysbvm_functionCallFrameStack_push(&callFrameStack,sVar1);
      lVar3 = lVar3 + 1;
    }
    if (bVar7 || uVar2 == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ulong *)(uVar2 + 0x10 + lVar4 * 8);
    }
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
        sVar1 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + uVar6 * 8);
      }
      else {
        sVar1 = 0;
      }
      sysbvm_functionCallFrameStack_push(&callFrameStack,sVar1);
    }
  }
  sysbvm_stackFrame_popRecord(&local_108);
  sVar1 = sysbvm_functionCallFrameStack_finish(context,&callFrameStack);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_apply(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    sysbvm_tuple_t *argumentList = &arguments[1];

    size_t variadicArgumentCount = sysbvm_array_getSize(*argumentList);
    size_t argumentListSize = 0;
    size_t callArgumentCount = 0;
    if(variadicArgumentCount > 0)
    {
        argumentListSize = sysbvm_array_getSize(sysbvm_array_at(*argumentList, variadicArgumentCount - 1));
        callArgumentCount = variadicArgumentCount - 1 + argumentListSize;
    }

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, *function, callArgumentCount, 0);
    if(variadicArgumentCount > 0)
    {
        for(size_t i = 0; i < variadicArgumentCount - 1; ++i)
            sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at(*argumentList, i));
        
        sysbvm_tuple_t argumentArray = sysbvm_array_at(*argumentList, variadicArgumentCount - 1);
        for(size_t i = 0; i < argumentListSize; ++i)
            sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at(argumentArray, i));
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    return sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
}